

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Dispatch_Engine::pop_function_call
          (Dispatch_Engine *this,Stack_Holder *t_s,Conversion_Saves *t_saves)

{
  int iVar1;
  int iVar2;
  
  iVar2 = t_s->call_depth;
  iVar1 = iVar2 + -1;
  t_s->call_depth = iVar1;
  if (0 < iVar2) {
    if (iVar1 == 0) {
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::clear
                ((t_s->call_params).
                 super__Vector_base<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
      t_saves->enabled = false;
    }
    return;
  }
  __assert_fail("t_s.call_depth >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/../dispatchkit/dispatchkit.hpp"
                ,0x3ee,
                "void chaiscript::detail::Dispatch_Engine::pop_function_call(Stack_Holder &, Type_Conversions::Conversion_Saves &)"
               );
}

Assistant:

void pop_function_call(Stack_Holder &t_s, Type_Conversions::Conversion_Saves &t_saves) {
        --t_s.call_depth;

        assert(t_s.call_depth >= 0);

        if (t_s.call_depth == 0) {
          t_s.call_params.back().clear();
          m_conversions.enable_conversion_saves(t_saves, false);
        }
      }